

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O0

void bb_color(long param_1,long param_2)

{
  bool bVar1;
  reference piVar2;
  const_iterator local_7e8;
  _List_node_base *local_7e0;
  undefined1 local_7d8 [32];
  iterator it;
  Vset cur;
  undefined1 local_50 [28];
  int v;
  list<int,_std::allocator<int>_> lv;
  int pt;
  int cnt_color;
  int *color_local;
  int *U_local;
  
  lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size._4_4_ = 0;
  lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size._0_4_ = 0;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)(local_50 + 0x18));
  for (local_50._20_4_ = 0; (int)local_50._20_4_ < size; local_50._20_4_ = local_50._20_4_ + 1) {
    std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_50,(size_t)&stack0x00000008);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_50);
    std::bitset<15000UL>::reference::~reference((reference *)local_50);
    if (bVar1) {
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)(local_50 + 0x18),
                 (value_type *)(local_50 + 0x14));
    }
  }
  while (bVar1 = std::__cxx11::list<int,_std::allocator<int>_>::empty
                           ((list<int,_std::allocator<int>_> *)(local_50 + 0x18)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    memcpy(&it,(bitset<15000UL> *)&stack0x00000008,0x758);
    lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size._4_4_ =
         lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size._4_4_ + 1;
    local_7d8._24_8_ =
         std::__cxx11::list<int,_std::allocator<int>_>::begin
                   ((list<int,_std::allocator<int>_> *)(local_50 + 0x18));
    while( true ) {
      local_7d8._16_8_ =
           std::__cxx11::list<int,_std::allocator<int>_>::end
                     ((list<int,_std::allocator<int>_> *)(local_50 + 0x18));
      bVar1 = std::operator!=((_Self *)(local_7d8 + 0x18),(_Self *)(local_7d8 + 0x10));
      if (!bVar1) break;
      std::_List_iterator<int>::operator*((_List_iterator<int> *)(local_7d8 + 0x18));
      std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_7d8,(size_t)&it);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_7d8);
      std::bitset<15000UL>::reference::~reference((reference *)local_7d8);
      if (bVar1) {
        piVar2 = std::_List_iterator<int>::operator*((_List_iterator<int> *)(local_7d8 + 0x18));
        std::bitset<15000UL>::operator&=((bitset<15000UL> *)&it,NC + *piVar2);
        piVar2 = std::_List_iterator<int>::operator*((_List_iterator<int> *)(local_7d8 + 0x18));
        std::bitset<15000UL>::reset((bitset<15000UL> *)&stack0x00000008,(long)*piVar2);
        piVar2 = std::_List_iterator<int>::operator*((_List_iterator<int> *)(local_7d8 + 0x18));
        *(int *)(param_1 +
                (long)(int)lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size *
                4) = *piVar2;
        *(int *)(param_2 +
                (long)(int)lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size *
                4) = lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size._4_4_;
        lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size._0_4_ =
             (int)lv.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size + 1;
        std::_List_const_iterator<int>::_List_const_iterator
                  (&local_7e8,(iterator *)(local_7d8 + 0x18));
        local_7e0 = (_List_node_base *)
                    std::__cxx11::list<int,_std::allocator<int>_>::erase
                              ((list<int,_std::allocator<int>_> *)(local_50 + 0x18),local_7e8);
        local_7d8._24_8_ = local_7e0;
      }
      else {
        std::_List_iterator<int>::operator++((_List_iterator<int> *)(local_7d8 + 0x18));
      }
    }
  }
  std::__cxx11::list<int,_std::allocator<int>_>::~list
            ((list<int,_std::allocator<int>_> *)(local_50 + 0x18));
  return;
}

Assistant:

void bb_color(Vset C, int *U, int *color) {
    int cnt_color = 0, pt = 0;
    list<int> lv;
    for (int v = 0; v < size; ++v)
        if (C[v]) lv.push_back(v);

    while(!lv.empty()) {
        Vset cur = C;
        ++cnt_color;
        for (list<int>::iterator it = lv.begin(); it != lv.end(); ) {
            if (cur[*it]) {
                cur &= NC[*it];
                C.reset(*it);
                U[pt] = *it;
                color[pt++] = cnt_color;
                it = lv.erase(it);
            } else ++it;
        }
    }
}